

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall soplex::SPxBasisBase<double>::loadDesc(SPxBasisBase<double> *this,Desc *ds)

{
  double dVar1;
  int iVar2;
  SPxOut *pSVar3;
  Status *pSVar4;
  SPxId *pSVar5;
  bool bVar6;
  char cVar7;
  Status SVar8;
  double *pdVar9;
  SVectorBase<double> *pSVar10;
  long lVar11;
  int iVar12;
  SPxSolverBase<double> *pSVar13;
  long lVar14;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *this_00;
  Verbosity old_verbosity;
  DataKey local_68;
  DataKey local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
    local_68.info = pSVar3->m_verbosity;
    local_60.info = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],
               "IBASIS02 loading of Basis invalidates factorization",0x33);
    cVar7 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_68);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  iVar12 = 0;
  this->iterCount = 0;
  this->updateCount = 0;
  this_00 = &(this->thedesc).rowstat;
  if ((Desc *)this_00 != ds) {
    Desc::operator=((Desc *)this_00,ds);
    reDim(this);
    this->minStab = 0.0;
    if (this->theLP->theRep == ROW) {
      (this->thedesc).stat = this_00;
      this_00 = &(this->thedesc).colstat;
    }
    else {
      (this->thedesc).stat = &(this->thedesc).colstat;
    }
    (this->thedesc).costat = this_00;
  }
  this->nzCount = 0;
  pSVar13 = this->theLP;
  iVar2 = (pSVar13->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  bVar6 = iVar2 < 1;
  if (0 < iVar2) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_58 = *pdVar9;
    uStack_50 = 0;
    local_48 = -local_58;
    uStack_40 = 0x8000000000000000;
    lVar14 = 0;
    iVar12 = 0;
    do {
      pSVar4 = (this->thedesc).rowstat.data;
      if (pSVar4[lVar14] < ~P_FREE) {
        dVar1 = (pSVar13->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar14];
        pdVar9 = (pSVar13->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + lVar14;
        if ((dVar1 != *pdVar9) || (NAN(dVar1) || NAN(*pdVar9))) {
          ::soplex::infinity::__tls_init();
          if ((dVar1 <= local_48) ||
             (((dVar1 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14], ::soplex::infinity::__tls_init(),
               dVar1 < local_58 &&
               (SVar8 = (this->thedesc).rowstat.data[lVar14], SVar8 != P_ON_LOWER)) &&
              ((SVar8 == P_ON_UPPER ||
               (0.0 < (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14])))))) {
            dVar1 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14];
            ::soplex::infinity::__tls_init();
            pSVar4 = (this->thedesc).rowstat.data;
            if (local_58 <= dVar1) {
              pSVar4[lVar14] = P_FREE;
            }
            else {
              pSVar4[lVar14] = P_ON_UPPER;
            }
          }
          else {
            (this->thedesc).rowstat.data[lVar14] = P_ON_LOWER;
          }
        }
        else {
          pSVar4[lVar14] = P_FIXED;
        }
      }
      else {
        SVar8 = dualRowStatus(this,(int)lVar14);
        (this->thedesc).rowstat.data[lVar14] = SVar8;
      }
      if (0 < this->theLP->theRep * (this->thedesc).rowstat.data[lVar14]) {
        if (iVar12 == (this->matrix).thesize) break;
        local_60 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar14];
        SPxRowId::SPxRowId((SPxRowId *)&local_68,&local_60);
        pSVar5 = (this->theBaseId).data;
        pSVar5[iVar12].super_DataKey = local_68;
        pSVar5[iVar12].super_DataKey.info = -1;
        pSVar10 = SPxSolverBase<double>::vector(this->theLP,(SPxRowId *)&local_68);
        (this->matrix).data[iVar12] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar12]->memused;
        iVar12 = iVar12 + 1;
      }
      lVar14 = lVar14 + 1;
      pSVar13 = this->theLP;
      lVar11 = (long)(pSVar13->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum;
      bVar6 = lVar11 <= lVar14;
    } while (lVar14 < lVar11);
  }
  pSVar13 = this->theLP;
  if (0 < (pSVar13->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_58 = *pdVar9;
    uStack_50 = 0;
    local_48 = -local_58;
    uStack_40 = 0x8000000000000000;
    lVar14 = 0;
    do {
      pSVar4 = (this->thedesc).colstat.data;
      if (pSVar4[lVar14] < ~P_FREE) {
        dVar1 = (pSVar13->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar14];
        pdVar9 = (pSVar13->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + lVar14;
        if ((dVar1 != *pdVar9) || (NAN(dVar1) || NAN(*pdVar9))) {
          ::soplex::infinity::__tls_init();
          if ((dVar1 <= local_48) ||
             (((dVar1 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14], ::soplex::infinity::__tls_init(),
               dVar1 < local_58 &&
               (SVar8 = (this->thedesc).colstat.data[lVar14], SVar8 != P_ON_LOWER)) &&
              ((SVar8 == P_ON_UPPER ||
               (0.0 < (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14])))))) {
            dVar1 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14];
            ::soplex::infinity::__tls_init();
            pSVar4 = (this->thedesc).colstat.data;
            if (local_58 <= dVar1) {
              pSVar4[lVar14] = P_FREE;
            }
            else {
              pSVar4[lVar14] = P_ON_UPPER;
            }
          }
          else {
            (this->thedesc).colstat.data[lVar14] = P_ON_LOWER;
          }
        }
        else {
          pSVar4[lVar14] = P_FIXED;
        }
      }
      else {
        SVar8 = dualColStatus(this,(int)lVar14);
        (this->thedesc).colstat.data[lVar14] = SVar8;
      }
      if (0 < this->theLP->theRep * (this->thedesc).colstat.data[lVar14]) {
        if (iVar12 == (this->matrix).thesize) {
          bVar6 = false;
          break;
        }
        local_60 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar14];
        SPxColId::SPxColId((SPxColId *)&local_68,&local_60);
        pSVar5 = (this->theBaseId).data;
        pSVar5[iVar12].super_DataKey = local_68;
        pSVar5[iVar12].super_DataKey.info = 1;
        pSVar10 = SPxSolverBase<double>::vector(this->theLP,(SPxColId *)&local_68);
        (this->matrix).data[iVar12] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar12]->memused;
        iVar12 = iVar12 + 1;
      }
      lVar14 = lVar14 + 1;
      pSVar13 = this->theLP;
    } while (lVar14 < (pSVar13->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  if ((bVar6) && ((this->matrix).thesize <= iVar12)) {
    this->matrixIsSetup = true;
  }
  else {
    restoreInitialBasis(this);
  }
  this->factorized = false;
  if (this->factor != (SLinSolver<double> *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}